

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O3

void __thiscall duckdb::MainHeader::Write(MainHeader *this,WriteStream *ser)

{
  char *pcVar1;
  ulong __n;
  idx_t i;
  long lVar2;
  data_t version [32];
  allocator local_69;
  undefined1 *local_68;
  ulong local_60;
  undefined1 local_58 [16];
  uint64_t local_48 [5];
  
  (**ser->_vptr_WriteStream)(ser,&MAGIC_BYTES,4);
  local_48[0] = this->version_number;
  (**ser->_vptr_WriteStream)(ser,local_48,8);
  lVar2 = 0;
  do {
    local_48[0] = this->flags[lVar2];
    (**ser->_vptr_WriteStream)(ser,local_48,8);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  pcVar1 = DuckDB::LibraryVersion();
  ::std::__cxx11::string::string((string *)&local_68,pcVar1,&local_69);
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  __n = local_60;
  if (0x1f < local_60) {
    __n = 0x20;
  }
  switchD_012b9b0d::default(local_48,local_68,__n);
  (**ser->_vptr_WriteStream)(ser,local_48,0x20);
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  pcVar1 = DuckDB::SourceID();
  ::std::__cxx11::string::string((string *)&local_68,pcVar1,&local_69);
  local_48[2] = 0;
  local_48[3] = 0;
  local_48[0] = 0;
  local_48[1] = 0;
  if (0x1f < local_60) {
    local_60 = 0x20;
  }
  switchD_012b9b0d::default(local_48,local_68,local_60);
  (**ser->_vptr_WriteStream)(ser,local_48,0x20);
  if (local_68 != local_58) {
    operator_delete(local_68);
  }
  return;
}

Assistant:

void MainHeader::Write(WriteStream &ser) {
	ser.WriteData(const_data_ptr_cast(MAGIC_BYTES), MAGIC_BYTE_SIZE);
	ser.Write<uint64_t>(version_number);
	for (idx_t i = 0; i < FLAG_COUNT; i++) {
		ser.Write<uint64_t>(flags[i]);
	}
	SerializeVersionNumber(ser, DuckDB::LibraryVersion());
	SerializeVersionNumber(ser, DuckDB::SourceID());
}